

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cornellbox.cpp
# Opt level: O0

Intersection * __thiscall CornellBox::intersects(CornellBox *this,Ray *r)

{
  size_type sVar1;
  reference ppTVar2;
  Intersection *pIVar3;
  int local_2c;
  int t;
  Intersection *tmp;
  Intersection *i;
  Ray *r_local;
  CornellBox *this_local;
  
  tmp = (Intersection *)0x0;
  local_2c = 0;
  while( true ) {
    sVar1 = std::vector<Triangle_*,_std::allocator<Triangle_*>_>::size(&this->triangles);
    if (sVar1 <= (ulong)(long)local_2c) break;
    ppTVar2 = std::vector<Triangle_*,_std::allocator<Triangle_*>_>::at
                        (&this->triangles,(long)local_2c);
    pIVar3 = Triangle::intersects(*ppTVar2,r);
    if (pIVar3 != (Intersection *)0x0) {
      tmp = pIVar3;
    }
    local_2c = local_2c + 1;
  }
  return tmp;
}

Assistant:

Intersection *CornellBox::intersects(Ray &r) {
    Intersection *i = NULL, *tmp;
    
    for(int t = 0; t < triangles.size(); ++t) {
    	tmp = triangles.at(t)->intersects(r);
        if( tmp ) {
            i = tmp;
        }
    }
    return i;
}